

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O3

void verify_sparse_file(archive *a,char *path,sparse *sparse,int expected_holes)

{
  anon_enum_32 aVar1;
  bool bVar2;
  archive *extra;
  wchar_t wVar3;
  int iVar4;
  int iVar5;
  archive_entry *paVar6;
  ulong uVar7;
  la_int64_t lVar8;
  la_int64_t v2;
  ulong uVar9;
  size_t sVar10;
  long v1;
  sparse *psVar11;
  long lVar12;
  void *pvVar13;
  void *_v1;
  char cVar14;
  char *pcVar15;
  int64_t offset;
  void *buff;
  size_t bytes_read;
  uint local_50;
  int local_4c;
  archive *local_48;
  char *local_40;
  archive_entry *local_38;
  
  local_50 = expected_holes;
  create_sparse_file(path,sparse);
  paVar6 = archive_entry_new();
  lVar12 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'œ',(uint)(paVar6 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  local_40 = path;
  wVar3 = archive_read_disk_open(a,path);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)wVar3,"archive_read_disk_open(a, path)",a);
  local_38 = paVar6;
  iVar4 = archive_read_next_header2(a,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header2(a, ae)",a);
  local_48 = a;
  iVar4 = archive_read_data_block(a,&buff,&bytes_read,&offset);
  if (iVar4 == 0) {
    v1 = 0;
    iVar4 = 0;
    lVar12 = 0;
    do {
      _v1 = buff;
      bVar2 = lVar12 < offset;
      sVar10 = sparse->size;
      lVar12 = sVar10 + v1;
      local_4c = iVar4;
      if (lVar12 < offset) {
        do {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                           ,L'Ũ',(uint)(sparse->type == HOLE),"sparse->type == HOLE",(void *)0x0);
          v1 = v1 + sparse->size;
          sVar10 = sparse[1].size;
          sparse = sparse + 1;
          lVar12 = sVar10 + v1;
        } while (lVar12 < offset);
      }
      if ((v1 < offset) && (lVar12 <= (long)(offset + bytes_read))) {
        pvVar13 = (void *)((long)buff + sVar10 + (v1 - offset));
        if (sparse->type == HOLE) {
          wVar3 = L'Ŵ';
          pcVar15 = "\'\\0\'";
          cVar14 = '\0';
LAB_001c58f0:
          assertion_memory_filled_with
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,wVar3,_v1,"start",(long)pvVar13 - (long)_v1,"end - start",cVar14,pcVar15,
                     (void *)0x0);
        }
        else {
          wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                   ,L'ŵ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                   (void *)0x0);
          if (wVar3 != L'\0') {
            wVar3 = L'Ŷ';
            pcVar15 = "\' \'";
            cVar14 = ' ';
            goto LAB_001c58f0;
          }
        }
        v1 = v1 + sparse->size;
        sparse = sparse + 1;
        _v1 = pvVar13;
      }
      sVar10 = sparse->size;
      uVar9 = sVar10 + v1;
      uVar7 = offset + bytes_read;
      psVar11 = sparse;
      if ((long)uVar9 <= (long)uVar7) {
        do {
          pvVar13 = (void *)((v1 - offset) + sVar10 + (long)buff);
          if (psVar11->type == DATA) {
            wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                     ,L'Ƒ',(uint)(uVar9 <= uVar7),
                                     "expected_offset + sparse->size <= offset + bytes_read",
                                     (void *)0x0);
            if (wVar3 != L'\0') {
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                               ,L'ƒ',(uint)(_v1 == (void *)((v1 - offset) + (long)buff)),
                               "start == (const char *)buff + (size_t)(expected_offset - offset)",
                               (void *)0x0);
              sVar10 = (long)pvVar13 - (long)_v1;
              wVar3 = L'Ɠ';
              pcVar15 = "\' \'";
              cVar14 = ' ';
              goto LAB_001c5a0c;
            }
          }
          else {
            if (psVar11->type != HOLE) {
              uVar7 = offset + bytes_read;
              sparse = psVar11;
              break;
            }
            if ((void *)((long)buff + bytes_read) < pvVar13) {
              pvVar13 = (void *)((long)buff + bytes_read);
            }
            sVar10 = (long)pvVar13 - (long)_v1;
            wVar3 = L'ƈ';
            pcVar15 = "\'\\0\'";
            cVar14 = '\0';
LAB_001c5a0c:
            assertion_memory_filled_with
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,wVar3,_v1,"start",sVar10,"end - start",cVar14,pcVar15,(void *)0x0);
          }
          _v1 = pvVar13;
          sparse = psVar11 + 1;
          v1 = v1 + psVar11->size;
          sVar10 = psVar11[1].size;
          uVar9 = sVar10 + v1;
          uVar7 = offset + bytes_read;
          psVar11 = sparse;
        } while ((long)uVar9 <= (long)uVar7);
      }
      sVar10 = bytes_read;
      pvVar13 = buff;
      if (v1 < (long)uVar7) {
        if (sparse->type == HOLE) {
          wVar3 = L'ƣ';
          pcVar15 = "\'\\0\'";
          cVar14 = '\0';
        }
        else {
          wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                   ,L'Ƥ',(uint)(sparse->type == DATA),"sparse->type == DATA",
                                   (void *)0x0);
          if (wVar3 == L'\0') goto LAB_001c5af7;
          wVar3 = L'ƥ';
          pcVar15 = "\' \'";
          cVar14 = ' ';
        }
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,wVar3,_v1,"start",(long)pvVar13 + (sVar10 - (long)_v1),"end - start",cVar14,
                   pcVar15,(void *)0x0);
      }
LAB_001c5af7:
      iVar4 = local_4c + (uint)bVar2;
      lVar12 = bytes_read + offset;
      iVar5 = archive_read_data_block(local_48,&buff,&bytes_read,&offset);
    } while (iVar5 == 0);
  }
  else {
    iVar4 = 0;
    v1 = 0;
  }
  paVar6 = local_38;
  lVar8 = archive_entry_size(local_38);
  aVar1 = sparse->type;
  while (aVar1 == HOLE) {
    v1 = v1 + sparse->size;
    aVar1 = sparse[1].type;
    sparse = sparse + 1;
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ƴ',(uint)(aVar1 == END),"sparse->type == END",(void *)0x0);
  v2 = archive_entry_size(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ƶ',v1,"expected_offset",v2,"archive_entry_size(ae)",(void *)0x0);
  failure("%s",local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ƹ',(long)(int)(iVar4 + (uint)(lVar12 < lVar8)),"holes_seen",
                      (ulong)local_50,"expected_holes",(void *)0x0);
  extra = local_48;
  iVar4 = archive_read_close(local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ƺ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",extra);
  archive_entry_free(paVar6);
  return;
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int expected_holes)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset, expected_offset, last_offset;
	int holes_seen = 0;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));

	expected_offset = 0;
	last_offset = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		const char *start = buff;
#if DEBUG
		fprintf(stderr, "%s: bytes_read=%d offset=%d\n", path, (int)bytes_read, (int)offset);
#endif
		if (offset > last_offset) {
			++holes_seen;
		}
		/* Blocks entirely before the data we just read. */
		while (expected_offset + (int64_t)sparse->size < offset) {
#if DEBUG
			fprintf(stderr, "    skipping expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			/* Must be holes. */
			assert(sparse->type == HOLE);
			expected_offset += sparse->size;
			++sparse;
		}
		/* Block that overlaps beginning of data */
		if (expected_offset < offset
		    && expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
#if DEBUG
			fprintf(stderr, "    overlapping hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
			start = end;
			expected_offset += sparse->size;
			++sparse;
		}
		/* Blocks completely contained in data we just read. */
		while (expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
			if (sparse->type == HOLE) {
#if DEBUG
				fprintf(stderr, "    contained hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif

				/* verify data corresponding to hole is '\0' */
				if (end > (const char *)buff + bytes_read) {
					end = (const char *)buff + bytes_read;
				}
				assertMemoryFilledWith(start, end - start, '\0');
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else if (sparse->type == DATA) {
#if DEBUG
				fprintf(stderr, "    contained data expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
				/* verify data corresponding to hole is ' ' */
				if (assert(expected_offset + sparse->size <= offset + bytes_read)) {
					assert(start == (const char *)buff + (size_t)(expected_offset - offset));
					assertMemoryFilledWith(start, end - start, ' ');
				}
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else {
				break;
			}
		}
		/* Block that overlaps end of data */
		if (expected_offset < offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + bytes_read;
#if DEBUG
			fprintf(stderr, "    trailing overlap expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
		}
		last_offset = offset + bytes_read;
	}
	/* Count a hole at EOF? */
	if (last_offset < archive_entry_size(ae)) {
		++holes_seen;
	}

	/* Verify blocks after last read */
	while (sparse->type == HOLE) {
		expected_offset += sparse->size;
		++sparse;
	}
	assert(sparse->type == END);
	assertEqualInt(expected_offset, archive_entry_size(ae));

	failure("%s", path);
	assertEqualInt(holes_seen, expected_holes);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}